

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void RGB32PackedToPlanar_SSE2(uint32_t *argb,__m128i *rgb)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  ushort uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  ushort uVar67;
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined3 uVar72;
  undefined3 uVar73;
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  uint uVar82;
  uint uVar83;
  undefined5 uVar84;
  undefined5 uVar85;
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [14];
  undefined1 auVar89 [14];
  uint32_t uVar90;
  uint32_t uVar91;
  uint32_t uVar92;
  uint32_t uVar93;
  uint32_t uVar94;
  uint32_t uVar95;
  uint32_t uVar96;
  uint32_t uVar97;
  undefined1 auVar98 [16];
  __m128i alVar106;
  __m128i alVar107;
  __m128i alVar108;
  undefined1 auVar109 [16];
  undefined1 auVar118 [16];
  __m128i alVar126;
  undefined1 auVar127 [16];
  __m128i alVar135;
  undefined1 auVar136 [16];
  undefined1 auVar144 [16];
  __m128i alVar152;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 uVar117;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined1 auVar145 [16];
  undefined1 auVar138 [16];
  undefined1 auVar146 [16];
  undefined1 auVar139 [16];
  undefined1 auVar147 [16];
  undefined1 auVar140 [16];
  undefined1 auVar148 [16];
  undefined1 auVar141 [16];
  undefined1 auVar149 [16];
  undefined1 auVar142 [16];
  undefined1 auVar150 [16];
  undefined1 auVar143 [16];
  undefined1 auVar151 [16];
  undefined1 uVar153;
  
  auVar1 = *(undefined1 (*) [16])argb;
  uVar90 = argb[4];
  uVar21 = *(undefined1 *)((long)argb + 0x11);
  uVar22 = *(undefined1 *)((long)argb + 0x13);
  uVar91 = argb[5];
  uVar23 = *(undefined1 *)((long)argb + 0x15);
  uVar92 = argb[6];
  uVar24 = *(undefined1 *)((long)argb + 0x19);
  uVar93 = argb[7];
  uVar25 = *(undefined1 *)((long)argb + 0x1d);
  uVar26 = *(undefined1 *)((long)argb + 0x1e);
  auVar2 = *(undefined1 (*) [16])(argb + 8);
  uVar94 = argb[0xc];
  uVar27 = *(undefined1 *)((long)argb + 0x31);
  uVar28 = *(undefined1 *)((long)argb + 0x32);
  uVar29 = *(undefined1 *)((long)argb + 0x33);
  uVar95 = argb[0xd];
  uVar30 = *(undefined1 *)((long)argb + 0x35);
  uVar31 = *(undefined1 *)((long)argb + 0x36);
  uVar96 = argb[0xe];
  uVar32 = *(undefined1 *)((long)argb + 0x39);
  uVar33 = *(undefined1 *)((long)argb + 0x3a);
  uVar97 = argb[0xf];
  uVar34 = *(undefined1 *)((long)argb + 0x3d);
  uVar35 = *(undefined1 *)((long)argb + 0x3e);
  auVar143._0_14_ = auVar1._0_14_;
  auVar143[0xe] = auVar1[7];
  auVar143[0xf] = *(undefined1 *)((long)argb + 0x17);
  auVar142._14_2_ = auVar143._14_2_;
  auVar142._0_13_ = auVar1._0_13_;
  auVar142[0xd] = *(undefined1 *)((long)argb + 0x16);
  auVar141._13_3_ = auVar142._13_3_;
  auVar141._0_12_ = auVar1._0_12_;
  auVar141[0xc] = auVar1[6];
  auVar140._12_4_ = auVar141._12_4_;
  auVar140._0_11_ = auVar1._0_11_;
  auVar140[0xb] = uVar23;
  uVar153 = auVar1[5];
  auVar139._11_5_ = auVar140._11_5_;
  auVar139._0_10_ = auVar1._0_10_;
  auVar139[10] = uVar153;
  auVar138._10_6_ = auVar139._10_6_;
  auVar138._0_9_ = auVar1._0_9_;
  auVar138[9] = (char)uVar91;
  auVar137._9_7_ = auVar138._9_7_;
  auVar137._0_8_ = auVar1._0_8_;
  auVar137[8] = auVar1[4];
  auVar40._1_8_ = auVar137._8_8_;
  auVar40[0] = uVar22;
  auVar40._9_7_ = 0;
  auVar39._10_6_ = 0;
  auVar39._0_10_ = SUB1610(auVar40 << 0x38,6);
  auVar38._11_5_ = 0;
  auVar38._0_11_ = SUB1611(auVar39 << 0x30,5);
  auVar37._12_4_ = 0;
  auVar37._0_12_ = SUB1612(auVar38 << 0x28,4);
  auVar36._13_3_ = 0;
  auVar36._0_13_ = SUB1613(auVar37 << 0x20,3);
  auVar136._14_2_ = 0;
  auVar136._0_14_ = SUB1614(auVar36 << 0x18,2);
  auVar136 = auVar136 << 0x10;
  auVar116._0_14_ = auVar2._0_14_;
  auVar116[0xe] = auVar2[7];
  auVar116[0xf] = *(undefined1 *)((long)argb + 0x37);
  auVar115._14_2_ = auVar116._14_2_;
  auVar115._0_13_ = auVar2._0_13_;
  auVar115[0xd] = uVar31;
  auVar114._13_3_ = auVar115._13_3_;
  auVar114._0_12_ = auVar2._0_12_;
  auVar114[0xc] = auVar2[6];
  auVar113._12_4_ = auVar114._12_4_;
  auVar113._0_11_ = auVar2._0_11_;
  auVar113[0xb] = uVar30;
  uVar117 = auVar2[5];
  auVar112._11_5_ = auVar113._11_5_;
  auVar112._0_10_ = auVar2._0_10_;
  auVar112[10] = uVar117;
  auVar111._10_6_ = auVar112._10_6_;
  auVar111._0_9_ = auVar2._0_9_;
  auVar111[9] = (char)uVar95;
  auVar110._9_7_ = auVar111._9_7_;
  auVar110._0_8_ = auVar2._0_8_;
  auVar110[8] = auVar2[4];
  auVar45._1_8_ = auVar110._8_8_;
  auVar45[0] = uVar29;
  auVar45._9_7_ = 0;
  auVar44._10_6_ = 0;
  auVar44._0_10_ = SUB1610(auVar45 << 0x38,6);
  auVar43._11_5_ = 0;
  auVar43._0_11_ = SUB1611(auVar44 << 0x30,5);
  auVar42._12_4_ = 0;
  auVar42._0_12_ = SUB1612(auVar43 << 0x28,4);
  auVar41._13_3_ = 0;
  auVar41._0_13_ = SUB1613(auVar42 << 0x20,3);
  auVar109._14_2_ = 0;
  auVar109._0_14_ = SUB1614(auVar41 << 0x18,2);
  auVar109 = auVar109 << 0x10;
  auVar134._0_14_ = auVar136._0_14_;
  auVar134[0xe] = uVar22;
  auVar134[0xf] = *(undefined1 *)((long)argb + 0x1b);
  auVar133._14_2_ = auVar134._14_2_;
  auVar133._0_13_ = auVar136._0_13_;
  auVar133[0xd] = auVar1[0xb];
  auVar132._13_3_ = auVar133._13_3_;
  auVar132._0_12_ = auVar136._0_12_;
  auVar132[0xc] = auVar1[3];
  auVar131._12_4_ = auVar132._12_4_;
  auVar131._0_11_ = auVar136._0_11_;
  auVar131[0xb] = *(undefined1 *)((long)argb + 0x1a);
  auVar130._11_5_ = auVar131._11_5_;
  auVar130._0_10_ = auVar136._0_10_;
  auVar130[10] = *(undefined1 *)((long)argb + 0x12);
  auVar129._10_6_ = auVar130._10_6_;
  auVar129._0_9_ = auVar136._0_9_;
  auVar129[9] = auVar1[10];
  auVar128._9_7_ = auVar129._9_7_;
  auVar128._0_8_ = auVar136._0_8_;
  auVar128[8] = auVar1[2];
  auVar50._1_8_ = auVar128._8_8_;
  auVar50[0] = uVar24;
  auVar50._9_7_ = 0;
  auVar49._10_6_ = 0;
  auVar49._0_10_ = SUB1610(auVar50 << 0x38,6);
  auVar48._11_5_ = 0;
  auVar48._0_11_ = SUB1611(auVar49 << 0x30,5);
  auVar47._12_4_ = 0;
  auVar47._0_12_ = SUB1612(auVar48 << 0x28,4);
  auVar46._13_3_ = 0;
  auVar46._0_13_ = SUB1613(auVar47 << 0x20,3);
  auVar127._14_2_ = 0;
  auVar127._0_14_ = SUB1614(auVar46 << 0x18,2);
  auVar127 = auVar127 << 0x10;
  auVar105._0_14_ = auVar109._0_14_;
  auVar105[0xe] = uVar29;
  auVar105[0xf] = *(undefined1 *)((long)argb + 0x3b);
  auVar104._14_2_ = auVar105._14_2_;
  auVar104._0_13_ = auVar109._0_13_;
  auVar104[0xd] = auVar2[0xb];
  auVar103._13_3_ = auVar104._13_3_;
  auVar103._0_12_ = auVar109._0_12_;
  auVar103[0xc] = auVar2[3];
  auVar102._12_4_ = auVar103._12_4_;
  auVar102._0_11_ = auVar109._0_11_;
  auVar102[0xb] = uVar33;
  auVar101._11_5_ = auVar102._11_5_;
  auVar101._0_10_ = auVar109._0_10_;
  auVar101[10] = uVar28;
  auVar100._10_6_ = auVar101._10_6_;
  auVar100._0_9_ = auVar109._0_9_;
  auVar100[9] = auVar2[10];
  auVar99._9_7_ = auVar100._9_7_;
  auVar99._0_8_ = auVar109._0_8_;
  auVar99[8] = auVar2[2];
  auVar55._1_8_ = auVar99._8_8_;
  auVar55[0] = uVar32;
  auVar55._9_7_ = 0;
  auVar54._10_6_ = 0;
  auVar54._0_10_ = SUB1610(auVar55 << 0x38,6);
  auVar53._11_5_ = 0;
  auVar53._0_11_ = SUB1611(auVar54 << 0x30,5);
  auVar52._12_4_ = 0;
  auVar52._0_12_ = SUB1612(auVar53 << 0x28,4);
  auVar51._13_3_ = 0;
  auVar51._0_13_ = SUB1613(auVar52 << 0x20,3);
  auVar98._14_2_ = 0;
  auVar98._0_14_ = SUB1614(auVar51 << 0x18,2);
  auVar98 = auVar98 << 0x10;
  auVar125._0_14_ = auVar127._0_14_;
  auVar125[0xe] = uVar24;
  auVar125[0xf] = uVar25;
  auVar124._14_2_ = auVar125._14_2_;
  auVar124._0_13_ = auVar127._0_13_;
  auVar124[0xd] = uVar23;
  auVar123._13_3_ = auVar124._13_3_;
  auVar123._0_12_ = auVar127._0_12_;
  auVar123[0xc] = uVar21;
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._0_11_ = auVar127._0_11_;
  auVar122[0xb] = auVar1[0xd];
  auVar121._11_5_ = auVar122._11_5_;
  auVar121._0_10_ = auVar127._0_10_;
  auVar121[10] = auVar1[9];
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._0_9_ = auVar127._0_9_;
  auVar120[9] = uVar153;
  auVar119._9_7_ = auVar120._9_7_;
  auVar119._0_8_ = auVar127._0_8_;
  auVar119[8] = auVar1[1];
  auVar60._1_8_ = auVar119._8_8_;
  auVar60[0] = (char)uVar93;
  auVar60._9_7_ = 0;
  auVar59._10_6_ = 0;
  auVar59._0_10_ = SUB1610(auVar60 << 0x38,6);
  auVar58._11_5_ = 0;
  auVar58._0_11_ = SUB1611(auVar59 << 0x30,5);
  auVar57._12_4_ = 0;
  auVar57._0_12_ = SUB1612(auVar58 << 0x28,4);
  auVar56._13_3_ = 0;
  auVar56._0_13_ = SUB1613(auVar57 << 0x20,3);
  auVar118._14_2_ = 0;
  auVar118._0_14_ = SUB1614(auVar56 << 0x18,2);
  auVar118 = auVar118 << 0x10;
  uVar61 = CONCAT11(auVar1[3],uVar26);
  uVar72 = CONCAT12(auVar1[7],uVar61);
  uVar82 = CONCAT13(auVar1[0xb],uVar72);
  uVar84 = CONCAT14(auVar1[0xf],uVar82);
  auVar88[5] = uVar22;
  auVar88._0_5_ = uVar84;
  auVar151._0_14_ = auVar98._0_14_;
  auVar151[0xe] = uVar32;
  auVar151[0xf] = uVar34;
  auVar150._14_2_ = auVar151._14_2_;
  auVar150._0_13_ = auVar98._0_13_;
  auVar150[0xd] = uVar30;
  auVar149._13_3_ = auVar150._13_3_;
  auVar149._0_12_ = auVar98._0_12_;
  auVar149[0xc] = uVar27;
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._0_11_ = auVar98._0_11_;
  auVar148[0xb] = auVar2[0xd];
  auVar147._11_5_ = auVar148._11_5_;
  auVar147._0_10_ = auVar98._0_10_;
  auVar147[10] = auVar2[9];
  auVar146._10_6_ = auVar147._10_6_;
  auVar146._0_9_ = auVar98._0_9_;
  auVar146[9] = uVar117;
  auVar145._9_7_ = auVar146._9_7_;
  auVar145._0_8_ = auVar98._0_8_;
  auVar145[8] = auVar2[1];
  auVar66._1_8_ = auVar145._8_8_;
  auVar66[0] = (char)uVar97;
  auVar66._9_7_ = 0;
  auVar65._10_6_ = 0;
  auVar65._0_10_ = SUB1610(auVar66 << 0x38,6);
  auVar64._11_5_ = 0;
  auVar64._0_11_ = SUB1611(auVar65 << 0x30,5);
  auVar63._12_4_ = 0;
  auVar63._0_12_ = SUB1612(auVar64 << 0x28,4);
  auVar62._13_3_ = 0;
  auVar62._0_13_ = SUB1613(auVar63 << 0x20,3);
  auVar144._14_2_ = 0;
  auVar144._0_14_ = SUB1614(auVar62 << 0x18,2);
  auVar144 = auVar144 << 0x10;
  uVar67 = CONCAT11(auVar2[3],uVar35);
  uVar73 = CONCAT12(auVar2[7],uVar67);
  uVar83 = CONCAT13(auVar2[0xb],uVar73);
  uVar85 = CONCAT14(auVar2[0xf],uVar83);
  auVar89[5] = uVar29;
  auVar89._0_5_ = uVar85;
  auVar88._6_8_ = 0;
  auVar3[0xe] = uVar26;
  auVar3._0_14_ = auVar88 << 0x38;
  auVar86._4_8_ = 0;
  auVar86._0_4_ = uVar82;
  auVar9._12_3_ =
       (int3)(CONCAT26(auVar3._13_2_,CONCAT15(*(undefined1 *)((long)argb + 0x1a),uVar84)) >> 0x28);
  auVar9._0_12_ = auVar86 << 0x38;
  auVar15._10_5_ =
       (int5)(CONCAT44(auVar9._11_4_,CONCAT13(*(undefined1 *)((long)argb + 0x16),uVar72)) >> 0x18);
  auVar15._0_10_ = (unkuint10)uVar61 << 0x38;
  auVar68._7_8_ = 0;
  auVar68._0_7_ =
       (uint7)(CONCAT62(auVar15._9_6_,CONCAT11(*(undefined1 *)((long)argb + 0x12),uVar26)) >> 8);
  auVar74._1_8_ = SUB158(auVar68 << 0x40,7);
  auVar74[0] = auVar1[0xe];
  auVar74._9_6_ = 0;
  auVar75._1_10_ = SUB1510(auVar74 << 0x30,5);
  auVar75[0] = auVar1[10];
  auVar75._11_4_ = 0;
  alVar135._3_12_ = SUB1512(auVar75 << 0x20,3);
  alVar135[0]._2_1_ = auVar1[6];
  alVar135[0]._0_2_ = (ushort)auVar1[2];
  alVar135[1]._7_1_ = 0;
  *rgb = alVar135;
  auVar89._6_8_ = 0;
  auVar4[0xe] = uVar35;
  auVar4._0_14_ = auVar89 << 0x38;
  auVar87._4_8_ = 0;
  auVar87._0_4_ = uVar83;
  auVar10._12_3_ = (int3)(CONCAT26(auVar4._13_2_,CONCAT15(uVar33,uVar85)) >> 0x28);
  auVar10._0_12_ = auVar87 << 0x38;
  auVar16._10_5_ = (int5)(CONCAT44(auVar10._11_4_,CONCAT13(uVar31,uVar73)) >> 0x18);
  auVar16._0_10_ = (unkuint10)uVar67 << 0x38;
  auVar69._7_8_ = 0;
  auVar69._0_7_ = (uint7)(CONCAT62(auVar16._9_6_,CONCAT11(uVar28,uVar35)) >> 8);
  auVar76._1_8_ = SUB158(auVar69 << 0x40,7);
  auVar76[0] = auVar2[0xe];
  auVar76._9_6_ = 0;
  auVar77._1_10_ = SUB1510(auVar76 << 0x30,5);
  auVar77[0] = auVar2[10];
  auVar77._11_4_ = 0;
  alVar106._3_12_ = SUB1512(auVar77 << 0x20,3);
  alVar106[0]._2_1_ = auVar2[6];
  alVar106[0]._0_2_ = (ushort)auVar2[2];
  alVar106[1]._7_1_ = 0;
  rgb[1] = alVar106;
  alVar107[0] = (ulong)CONCAT16(auVar1[0xd],
                                (uint6)CONCAT14(auVar1[9],(uint)CONCAT12(uVar153,(ushort)auVar1[1]))
                               );
  alVar107[1]._0_1_ = uVar21;
  alVar107[1]._1_1_ = 0;
  alVar107[1]._2_1_ = uVar23;
  alVar107[1]._3_1_ = 0;
  alVar107[1]._4_1_ = uVar24;
  alVar107[1]._5_1_ = 0;
  alVar107[1]._6_1_ = uVar25;
  alVar107[1]._7_1_ = 0;
  rgb[2] = alVar107;
  alVar108[0] = (ulong)CONCAT16(auVar2[0xd],
                                (uint6)CONCAT14(auVar2[9],(uint)CONCAT12(uVar117,(ushort)auVar2[1]))
                               );
  alVar108[1]._0_1_ = uVar27;
  alVar108[1]._1_1_ = 0;
  alVar108[1]._2_1_ = uVar30;
  alVar108[1]._3_1_ = 0;
  alVar108[1]._4_1_ = uVar32;
  alVar108[1]._5_1_ = 0;
  alVar108[1]._6_1_ = uVar34;
  alVar108[1]._7_1_ = 0;
  rgb[3] = alVar108;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar118._0_13_;
  auVar5[0xe] = (char)uVar93;
  auVar7[0xc] = (char)uVar92;
  auVar7._0_12_ = auVar118._0_12_;
  auVar7._13_2_ = auVar5._13_2_;
  auVar11[0xb] = 0;
  auVar11._0_11_ = auVar118._0_11_;
  auVar11._12_3_ = auVar7._12_3_;
  auVar13[10] = (char)uVar91;
  auVar13._0_10_ = auVar118._0_10_;
  auVar13._11_4_ = auVar11._11_4_;
  auVar17[9] = 0;
  auVar17._0_9_ = auVar118._0_9_;
  auVar17._10_5_ = auVar13._10_5_;
  auVar19[8] = (char)uVar90;
  auVar19._0_8_ = auVar118._0_8_;
  auVar19._9_6_ = auVar17._9_6_;
  auVar70._7_8_ = 0;
  auVar70._0_7_ = auVar19._8_7_;
  auVar78._1_8_ = SUB158(auVar70 << 0x40,7);
  auVar78[0] = auVar1[0xc];
  auVar78._9_6_ = 0;
  auVar79._1_10_ = SUB1510(auVar78 << 0x30,5);
  auVar79[0] = auVar1[8];
  auVar79._11_4_ = 0;
  alVar126._3_12_ = SUB1512(auVar79 << 0x20,3);
  alVar126[0]._2_1_ = auVar1[4];
  alVar126[0]._0_2_ = (ushort)auVar1[0];
  alVar126[1]._7_1_ = 0;
  rgb[4] = alVar126;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar144._0_13_;
  auVar6[0xe] = (char)uVar97;
  auVar8[0xc] = (char)uVar96;
  auVar8._0_12_ = auVar144._0_12_;
  auVar8._13_2_ = auVar6._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar144._0_11_;
  auVar12._12_3_ = auVar8._12_3_;
  auVar14[10] = (char)uVar95;
  auVar14._0_10_ = auVar144._0_10_;
  auVar14._11_4_ = auVar12._11_4_;
  auVar18[9] = 0;
  auVar18._0_9_ = auVar144._0_9_;
  auVar18._10_5_ = auVar14._10_5_;
  auVar20[8] = (char)uVar94;
  auVar20._0_8_ = auVar144._0_8_;
  auVar20._9_6_ = auVar18._9_6_;
  auVar71._7_8_ = 0;
  auVar71._0_7_ = auVar20._8_7_;
  auVar80._1_8_ = SUB158(auVar71 << 0x40,7);
  auVar80[0] = auVar2[0xc];
  auVar80._9_6_ = 0;
  auVar81._1_10_ = SUB1510(auVar80 << 0x30,5);
  auVar81[0] = auVar2[8];
  auVar81._11_4_ = 0;
  alVar152._3_12_ = SUB1512(auVar81 << 0x20,3);
  alVar152[0]._2_1_ = auVar2[4];
  alVar152[0]._0_2_ = (ushort)auVar2[0];
  alVar152[1]._7_1_ = 0;
  rgb[5] = alVar152;
  return;
}

Assistant:

static WEBP_INLINE void RGB32PackedToPlanar_SSE2(
    const uint32_t* WEBP_RESTRICT const argb, __m128i* const rgb /*in[6]*/) {
  const __m128i zero = _mm_setzero_si128();
  __m128i a0 = LOAD_16(argb + 0);
  __m128i a1 = LOAD_16(argb + 4);
  __m128i a2 = LOAD_16(argb + 8);
  __m128i a3 = LOAD_16(argb + 12);
  VP8L32bToPlanar_SSE2(&a0, &a1, &a2, &a3);
  rgb[0] = _mm_unpacklo_epi8(a1, zero);
  rgb[1] = _mm_unpackhi_epi8(a1, zero);
  rgb[2] = _mm_unpacklo_epi8(a2, zero);
  rgb[3] = _mm_unpackhi_epi8(a2, zero);
  rgb[4] = _mm_unpacklo_epi8(a3, zero);
  rgb[5] = _mm_unpackhi_epi8(a3, zero);
}